

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O0

void __thiscall spvtools::opt::UpgradeMemoryModel::CleanupDecorations(UpgradeMemoryModel *this)

{
  Module *this_00;
  anon_class_8_1_8991fb9c local_38;
  function<void_(spvtools::opt::Instruction_*)> local_30;
  UpgradeMemoryModel *local_10;
  UpgradeMemoryModel *this_local;
  
  local_10 = this;
  this_00 = Pass::get_module(&this->super_Pass);
  local_38.this = this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::UpgradeMemoryModel::CleanupDecorations()::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_30,&local_38);
  Module::ForEachInst(this_00,&local_30,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_30);
  return;
}

Assistant:

void UpgradeMemoryModel::CleanupDecorations() {
  // All of the volatile and coherent decorations have been dealt with, so now
  // we can just remove them.
  get_module()->ForEachInst([this](Instruction* inst) {
    if (inst->result_id() != 0) {
      context()->get_decoration_mgr()->RemoveDecorationsFrom(
          inst->result_id(), [](const Instruction& dec) {
            switch (dec.opcode()) {
              case spv::Op::OpDecorate:
              case spv::Op::OpDecorateId:
                if (spv::Decoration(dec.GetSingleWordInOperand(1u)) ==
                        spv::Decoration::Coherent ||
                    spv::Decoration(dec.GetSingleWordInOperand(1u)) ==
                        spv::Decoration::Volatile)
                  return true;
                break;
              case spv::Op::OpMemberDecorate:
                if (spv::Decoration(dec.GetSingleWordInOperand(2u)) ==
                        spv::Decoration::Coherent ||
                    spv::Decoration(dec.GetSingleWordInOperand(2u)) ==
                        spv::Decoration::Volatile)
                  return true;
                break;
              default:
                break;
            }
            return false;
          });
    }
  });
}